

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

Writer * __thiscall el::base::Writer::construct(Writer *this,int count,char *loggerIds,...)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char in_AL;
  undefined8 *puVar1;
  reference loggerId;
  undefined8 in_RCX;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator local_129;
  va_list loggersList;
  string local_108;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((*(byte *)(elStorage + 0x18) & 0x80) == 0) {
    std::__cxx11::string::string((string *)&local_108,loggerIds,(allocator *)loggersList);
    initializeLogger(this,&local_108,true,true);
    std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    loggersList[0].reg_save_area = local_e8;
    loggersList[0].overflow_arg_area = &stack0x00000008;
    loggersList[0].gp_offset = 0x18;
    loggersList[0].fp_offset = 0x30;
    this_00 = &this->m_loggerIds;
    utils::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,(long)count);
    iVar4 = 0;
    if (0 < count) {
      iVar4 = count;
    }
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      std::__cxx11::string::string((string *)&local_108,loggerIds,&local_129);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &local_108);
      std::__cxx11::string::~string((string *)&local_108);
      uVar2 = loggersList[0]._0_8_ & 0xffffffff;
      if (uVar2 < 0x29) {
        loggersList[0].gp_offset = loggersList[0].gp_offset + 8;
        puVar1 = (undefined8 *)(uVar2 + (long)loggersList[0].reg_save_area);
      }
      else {
        puVar1 = (undefined8 *)loggersList[0].overflow_arg_area;
        loggersList[0].overflow_arg_area = (void *)((long)loggersList[0].overflow_arg_area + 8);
      }
      loggerIds = (char *)*puVar1;
    }
    loggerId = utils::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,0);
    initializeLogger(this,(string *)loggerId,true,true);
  }
  (this->m_messageBuilder).m_logger = this->m_logger;
  pcVar3 = "\n    ";
  if ((*(byte *)(elStorage + 0x18) & 1) == 0) {
    pcVar3 = ", ";
  }
  (this->m_messageBuilder).m_containerLogSeperator = pcVar3;
  return this;
}

Assistant:

Writer& Writer::construct(int count, const char* loggerIds, ...) {
  if (ELPP->hasFlag(LoggingFlag::MultiLoggerSupport)) {
    va_list loggersList;
    va_start(loggersList, loggerIds);
    const char* id = loggerIds;
    m_loggerIds.reserve(count);
    for (int i = 0; i < count; ++i) {
      m_loggerIds.push_back(std::string(id));
      id = va_arg(loggersList, const char*);
    }
    va_end(loggersList);
    initializeLogger(m_loggerIds.at(0));
  } else {
    initializeLogger(std::string(loggerIds));
  }
  m_messageBuilder.initialize(m_logger);
  return *this;
}